

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

int INT_REVstone_set_output(CMConnection conn,EVstone stone,int output_index,EVstone target_stone)

{
  int condition;
  CMFormat format;
  EVstone_set_output_request request;
  EV_int_response response;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38 [4];
  int local_34;
  
  local_48 = 0;
  uStack_40 = 0;
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVstone_set_output_req_formats);
  uStack_40 = CONCAT44(target_stone,output_index);
  local_48 = CONCAT44(stone,condition);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVstone_set_output_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,local_38);
  INT_CMwrite(conn,format,&local_48);
  INT_CMCondition_wait(conn->cm,condition);
  return local_34;
}

Assistant:

extern int
INT_REVstone_set_output(CMConnection conn, EVstone stone, int output_index, EVstone target_stone)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVstone_set_output_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVstone_set_output_req_formats);
    request.stone = stone;
    request.output_index = output_index;
    request.target_stone = target_stone;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVstone_set_output_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return response.ret;
}